

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

UniquePtr<EVP_PKEY> MakeTestKey(void)

{
  bool bVar1;
  int iVar2;
  pointer peVar3;
  EVP_PKEY *__p;
  pointer pkey;
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_30;
  UniquePtr<EVP_PKEY> evp_pkey;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_18;
  UniquePtr<EC_KEY> ec_key;
  
  peVar3 = (pointer)EC_KEY_new_by_curve_name(0x19f);
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&local_18,peVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
  if (bVar1) {
    peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_18);
    iVar2 = EC_KEY_generate_key((EC_KEY *)peVar3);
    if (iVar2 != 0) {
      __p = EVP_PKEY_new();
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_30,(pointer)__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
      if (bVar1) {
        pkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_30);
        peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::release(&local_18);
        iVar2 = EVP_PKEY_assign_EC_KEY(pkey,peVar3);
        if (iVar2 == 0) goto LAB_004eef5a;
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                   in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,&local_30);
      }
      else {
LAB_004eef5a:
        std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)
                   in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,(nullptr_t)0x0);
      }
      evp_pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._0_4_ = 1;
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
      goto LAB_004eefa4;
    }
  }
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)
             in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,(nullptr_t)0x0);
  evp_pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._0_4_ = 1;
LAB_004eefa4:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> MakeTestKey() {
  bssl::UniquePtr<EC_KEY> ec_key(
      EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  if (!ec_key ||
      !EC_KEY_generate_key(ec_key.get())) {
    return nullptr;
  }
  bssl::UniquePtr<EVP_PKEY> evp_pkey(EVP_PKEY_new());
  if (!evp_pkey ||
      !EVP_PKEY_assign_EC_KEY(evp_pkey.get(), ec_key.release())) {
    return nullptr;
  }
  return evp_pkey;
}